

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

ExprList * sqlite3ExprListDup(sqlite3 *db,ExprList *p,int flags)

{
  ExprList_item *pEVar1;
  int iVar2;
  ExprList *p_00;
  ExprList_item *pEVar3;
  Expr *pEVar4;
  char *pcVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  
  if ((p != (ExprList *)0x0) &&
     (p_00 = (ExprList *)sqlite3DbMallocRaw(db,0x10), p_00 != (ExprList *)0x0)) {
    p_00->iECursor = 0;
    iVar7 = p->nExpr;
    p_00->nExpr = iVar7;
    iVar8 = iVar7;
    if ((flags & 1U) == 0) {
      iVar2 = 1;
      do {
        iVar8 = iVar2;
        iVar2 = iVar8 * 2;
      } while (iVar8 < iVar7);
    }
    pEVar3 = (ExprList_item *)sqlite3DbMallocRaw(db,iVar8 << 5);
    p_00->a = pEVar3;
    if (pEVar3 != (ExprList_item *)0x0) {
      if (p->nExpr < 1) {
        return p_00;
      }
      pEVar1 = p->a;
      lVar6 = 0;
      iVar7 = 0;
      do {
        pEVar4 = exprDup(db,*(Expr **)((long)&pEVar1->pExpr + lVar6),flags,(u8 **)0x0);
        *(Expr **)((long)&pEVar3->pExpr + lVar6) = pEVar4;
        pcVar5 = sqlite3DbStrDup(db,*(char **)((long)&pEVar1->zName + lVar6));
        *(char **)((long)&pEVar3->zName + lVar6) = pcVar5;
        pcVar5 = sqlite3DbStrDup(db,*(char **)((long)&pEVar1->zSpan + lVar6));
        *(char **)((long)&pEVar3->zSpan + lVar6) = pcVar5;
        (&pEVar3->sortOrder)[lVar6] = (&pEVar1->sortOrder)[lVar6];
        (&pEVar3->field_0x19)[lVar6] = (&pEVar3->field_0x19)[lVar6] & 0xfe;
        *(undefined4 *)((long)&pEVar3->iOrderByCol + lVar6) =
             *(undefined4 *)((long)&pEVar1->iOrderByCol + lVar6);
        iVar7 = iVar7 + 1;
        lVar6 = lVar6 + 0x20;
      } while (iVar7 < p->nExpr);
      return p_00;
    }
    sqlite3DbFree(db,p_00);
  }
  return (ExprList *)0x0;
}

Assistant:

SQLITE_PRIVATE ExprList *sqlite3ExprListDup(sqlite3 *db, ExprList *p, int flags){
  ExprList *pNew;
  struct ExprList_item *pItem, *pOldItem;
  int i;
  if( p==0 ) return 0;
  pNew = sqlite3DbMallocRaw(db, sizeof(*pNew) );
  if( pNew==0 ) return 0;
  pNew->iECursor = 0;
  pNew->nExpr = i = p->nExpr;
  if( (flags & EXPRDUP_REDUCE)==0 ) for(i=1; i<p->nExpr; i+=i){}
  pNew->a = pItem = sqlite3DbMallocRaw(db,  i*sizeof(p->a[0]) );
  if( pItem==0 ){
    sqlite3DbFree(db, pNew);
    return 0;
  } 
  pOldItem = p->a;
  for(i=0; i<p->nExpr; i++, pItem++, pOldItem++){
    Expr *pOldExpr = pOldItem->pExpr;
    pItem->pExpr = sqlite3ExprDup(db, pOldExpr, flags);
    pItem->zName = sqlite3DbStrDup(db, pOldItem->zName);
    pItem->zSpan = sqlite3DbStrDup(db, pOldItem->zSpan);
    pItem->sortOrder = pOldItem->sortOrder;
    pItem->done = 0;
    pItem->iOrderByCol = pOldItem->iOrderByCol;
    pItem->iAlias = pOldItem->iAlias;
  }
  return pNew;
}